

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RepeatProd * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol::RepeatProd,slang::ast::Expression_const&,slang::ast::RandSeqProductionSymbol::ProdItem&>
          (BumpAllocator *this,Expression *args,ProdItem *args_1)

{
  RandSeqProductionSymbol *pRVar1;
  pointer ppEVar2;
  size_t sVar3;
  ProdBase PVar4;
  undefined4 uVar5;
  RepeatProd *pRVar6;
  
  pRVar6 = (RepeatProd *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RepeatProd *)this->endPtr < pRVar6 + 1) {
    pRVar6 = (RepeatProd *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pRVar6 + 1);
  }
  PVar4.kind = (args_1->super_ProdBase).kind;
  uVar5 = *(undefined4 *)&args_1->field_0x4;
  pRVar1 = args_1->target;
  ppEVar2 = (args_1->args)._M_ptr;
  sVar3 = (args_1->args)._M_extent._M_extent_value;
  (pRVar6->super_ProdBase).kind = Repeat;
  (pRVar6->expr).ptr = args;
  (pRVar6->item).super_ProdBase = (ProdBase)PVar4.kind;
  *(undefined4 *)&(pRVar6->item).field_0x4 = uVar5;
  (pRVar6->item).target = pRVar1;
  (pRVar6->item).args._M_ptr = ppEVar2;
  (pRVar6->item).args._M_extent._M_extent_value = sVar3;
  return pRVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }